

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcInfoTests.cpp
# Opt level: O3

IterateResult __thiscall deqp::RenderTargetInfoCase::iterate(RenderTargetInfoCase *this)

{
  TestLog *this_00;
  RenderTargetInfoCase *pRVar1;
  int iVar2;
  undefined4 extraout_var;
  char *__end;
  string local_788;
  string local_768;
  string local_748;
  string local_728;
  string local_708;
  string local_6e8;
  string local_6c8;
  string local_6a8;
  string local_688;
  string local_668;
  string local_648;
  string local_628;
  string local_608;
  string local_5e8;
  string local_5c8;
  string local_5a8;
  string local_588;
  string local_568;
  string local_548;
  string local_528;
  string local_508;
  string local_4e8;
  string local_4c8;
  RenderTargetInfoCase *local_4a8;
  string local_4a0;
  string local_480;
  string local_460;
  string local_440;
  LogNumber<long> local_420;
  LogNumber<long> local_3b0;
  LogNumber<long> local_340;
  LogNumber<long> local_2d0;
  LogNumber<long> local_260;
  LogNumber<long> local_1f0;
  LogNumber<long> local_180;
  LogNumber<long> local_110;
  LogNumber<long> local_a0;
  int *piVar3;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
  piVar3 = (int *)CONCAT44(extraout_var,iVar2);
  this_00 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c8,"Width","");
  local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e8,"Width","");
  local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"px","");
  tcu::LogNumber<long>::LogNumber
            (&local_a0,&local_4c8,&local_4e8,&local_508,QP_KEY_TAG_NONE,(long)*piVar3);
  tcu::TestLog::writeInteger
            (this_00,local_a0.m_name._M_dataplus._M_p,local_a0.m_desc._M_dataplus._M_p,
             local_a0.m_unit._M_dataplus._M_p,local_a0.m_tag,local_a0.m_value);
  local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_528,"Height","");
  local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_548,"Height","");
  local_568._M_dataplus._M_p = (pointer)&local_568.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_568,"px","");
  tcu::LogNumber<long>::LogNumber
            (&local_110,&local_528,&local_548,&local_568,QP_KEY_TAG_NONE,(long)piVar3[1]);
  tcu::TestLog::writeInteger
            (this_00,local_110.m_name._M_dataplus._M_p,local_110.m_desc._M_dataplus._M_p,
             local_110.m_unit._M_dataplus._M_p,local_110.m_tag,local_110.m_value);
  local_588._M_dataplus._M_p = (pointer)&local_588.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_588,"RedBits","");
  local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a8,"Red bits","");
  local_5c8._M_dataplus._M_p = (pointer)&local_5c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5c8,0x1af8059);
  tcu::LogNumber<long>::LogNumber
            (&local_180,&local_588,&local_5a8,&local_5c8,QP_KEY_TAG_NONE,(long)piVar3[2]);
  tcu::TestLog::writeInteger
            (this_00,local_180.m_name._M_dataplus._M_p,local_180.m_desc._M_dataplus._M_p,
             local_180.m_unit._M_dataplus._M_p,local_180.m_tag,local_180.m_value);
  local_5e8._M_dataplus._M_p = (pointer)&local_5e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5e8,"GreenBits","");
  local_608._M_dataplus._M_p = (pointer)&local_608.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_608,"Green bits","");
  local_628._M_dataplus._M_p = (pointer)&local_628.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_628,0x1af8059);
  tcu::LogNumber<long>::LogNumber
            (&local_1f0,&local_5e8,&local_608,&local_628,QP_KEY_TAG_NONE,(long)piVar3[3]);
  tcu::TestLog::writeInteger
            (this_00,local_1f0.m_name._M_dataplus._M_p,local_1f0.m_desc._M_dataplus._M_p,
             local_1f0.m_unit._M_dataplus._M_p,local_1f0.m_tag,local_1f0.m_value);
  local_648._M_dataplus._M_p = (pointer)&local_648.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_648,"BlueBits","");
  local_668._M_dataplus._M_p = (pointer)&local_668.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_668,"Blue bits","");
  local_688._M_dataplus._M_p = (pointer)&local_688.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_688,0x1af8059);
  tcu::LogNumber<long>::LogNumber
            (&local_260,&local_648,&local_668,&local_688,QP_KEY_TAG_NONE,(long)piVar3[4]);
  tcu::TestLog::writeInteger
            (this_00,local_260.m_name._M_dataplus._M_p,local_260.m_desc._M_dataplus._M_p,
             local_260.m_unit._M_dataplus._M_p,local_260.m_tag,local_260.m_value);
  local_6a8._M_dataplus._M_p = (pointer)&local_6a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a8,"AlphaBits","");
  local_6c8._M_dataplus._M_p = (pointer)&local_6c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6c8,"Alpha bits","");
  local_6e8._M_dataplus._M_p = (pointer)&local_6e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6e8,0x1af8059);
  tcu::LogNumber<long>::LogNumber
            (&local_2d0,&local_6a8,&local_6c8,&local_6e8,QP_KEY_TAG_NONE,(long)piVar3[5]);
  tcu::TestLog::writeInteger
            (this_00,local_2d0.m_name._M_dataplus._M_p,local_2d0.m_desc._M_dataplus._M_p,
             local_2d0.m_unit._M_dataplus._M_p,local_2d0.m_tag,local_2d0.m_value);
  local_708._M_dataplus._M_p = (pointer)&local_708.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_708,"DepthBits","");
  local_728._M_dataplus._M_p = (pointer)&local_728.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_728,"Depth bits","");
  local_748._M_dataplus._M_p = (pointer)&local_748.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_748,0x1af8059);
  tcu::LogNumber<long>::LogNumber
            (&local_340,&local_708,&local_728,&local_748,QP_KEY_TAG_NONE,(long)piVar3[6]);
  tcu::TestLog::writeInteger
            (this_00,local_340.m_name._M_dataplus._M_p,local_340.m_desc._M_dataplus._M_p,
             local_340.m_unit._M_dataplus._M_p,local_340.m_tag,local_340.m_value);
  local_768._M_dataplus._M_p = (pointer)&local_768.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"StencilBits","");
  local_788._M_dataplus._M_p = (pointer)&local_788.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_788,"Stencil bits","");
  local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_440,0x1af8059);
  tcu::LogNumber<long>::LogNumber
            (&local_3b0,&local_768,&local_788,&local_440,QP_KEY_TAG_NONE,(long)piVar3[7]);
  tcu::TestLog::writeInteger
            (this_00,local_3b0.m_name._M_dataplus._M_p,local_3b0.m_desc._M_dataplus._M_p,
             local_3b0.m_unit._M_dataplus._M_p,local_3b0.m_tag,local_3b0.m_value);
  local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"SampleCount","");
  local_4a8 = this;
  local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,"Sample count","");
  local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a0,0x1af8059);
  tcu::LogNumber<long>::LogNumber
            (&local_420,&local_460,&local_480,&local_4a0,QP_KEY_TAG_NONE,(long)piVar3[8]);
  tcu::TestLog::writeInteger
            (this_00,local_420.m_name._M_dataplus._M_p,local_420.m_desc._M_dataplus._M_p,
             local_420.m_unit._M_dataplus._M_p,local_420.m_tag,local_420.m_value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_420.m_unit._M_dataplus._M_p != &local_420.m_unit.field_2) {
    operator_delete(local_420.m_unit._M_dataplus._M_p,
                    local_420.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_420.m_desc._M_dataplus._M_p != &local_420.m_desc.field_2) {
    operator_delete(local_420.m_desc._M_dataplus._M_p,
                    local_420.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_420.m_name._M_dataplus._M_p != &local_420.m_name.field_2) {
    operator_delete(local_420.m_name._M_dataplus._M_p,
                    local_420.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
    operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_480._M_dataplus._M_p != &local_480.field_2) {
    operator_delete(local_480._M_dataplus._M_p,local_480.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460._M_dataplus._M_p != &local_460.field_2) {
    operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0.m_unit._M_dataplus._M_p != &local_3b0.m_unit.field_2) {
    operator_delete(local_3b0.m_unit._M_dataplus._M_p,
                    local_3b0.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0.m_desc._M_dataplus._M_p != &local_3b0.m_desc.field_2) {
    operator_delete(local_3b0.m_desc._M_dataplus._M_p,
                    local_3b0.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0.m_name._M_dataplus._M_p != &local_3b0.m_name.field_2) {
    operator_delete(local_3b0.m_name._M_dataplus._M_p,
                    local_3b0.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_440._M_dataplus._M_p != &local_440.field_2) {
    operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_788._M_dataplus._M_p != &local_788.field_2) {
    operator_delete(local_788._M_dataplus._M_p,local_788.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_768._M_dataplus._M_p != &local_768.field_2) {
    operator_delete(local_768._M_dataplus._M_p,local_768.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340.m_unit._M_dataplus._M_p != &local_340.m_unit.field_2) {
    operator_delete(local_340.m_unit._M_dataplus._M_p,
                    local_340.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340.m_desc._M_dataplus._M_p != &local_340.m_desc.field_2) {
    operator_delete(local_340.m_desc._M_dataplus._M_p,
                    local_340.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340.m_name._M_dataplus._M_p != &local_340.m_name.field_2) {
    operator_delete(local_340.m_name._M_dataplus._M_p,
                    local_340.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_748._M_dataplus._M_p != &local_748.field_2) {
    operator_delete(local_748._M_dataplus._M_p,local_748.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_728._M_dataplus._M_p != &local_728.field_2) {
    operator_delete(local_728._M_dataplus._M_p,local_728.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_708._M_dataplus._M_p != &local_708.field_2) {
    operator_delete(local_708._M_dataplus._M_p,local_708.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0.m_unit._M_dataplus._M_p != &local_2d0.m_unit.field_2) {
    operator_delete(local_2d0.m_unit._M_dataplus._M_p,
                    local_2d0.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0.m_desc._M_dataplus._M_p != &local_2d0.m_desc.field_2) {
    operator_delete(local_2d0.m_desc._M_dataplus._M_p,
                    local_2d0.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0.m_name._M_dataplus._M_p != &local_2d0.m_name.field_2) {
    operator_delete(local_2d0.m_name._M_dataplus._M_p,
                    local_2d0.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6e8._M_dataplus._M_p != &local_6e8.field_2) {
    operator_delete(local_6e8._M_dataplus._M_p,local_6e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c8._M_dataplus._M_p != &local_6c8.field_2) {
    operator_delete(local_6c8._M_dataplus._M_p,local_6c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6a8._M_dataplus._M_p != &local_6a8.field_2) {
    operator_delete(local_6a8._M_dataplus._M_p,local_6a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260.m_unit._M_dataplus._M_p != &local_260.m_unit.field_2) {
    operator_delete(local_260.m_unit._M_dataplus._M_p,
                    local_260.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260.m_desc._M_dataplus._M_p != &local_260.m_desc.field_2) {
    operator_delete(local_260.m_desc._M_dataplus._M_p,
                    local_260.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260.m_name._M_dataplus._M_p != &local_260.m_name.field_2) {
    operator_delete(local_260.m_name._M_dataplus._M_p,
                    local_260.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_688._M_dataplus._M_p != &local_688.field_2) {
    operator_delete(local_688._M_dataplus._M_p,local_688.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_668._M_dataplus._M_p != &local_668.field_2) {
    operator_delete(local_668._M_dataplus._M_p,local_668.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_648._M_dataplus._M_p != &local_648.field_2) {
    operator_delete(local_648._M_dataplus._M_p,local_648.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0.m_unit._M_dataplus._M_p != &local_1f0.m_unit.field_2) {
    operator_delete(local_1f0.m_unit._M_dataplus._M_p,
                    local_1f0.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0.m_desc._M_dataplus._M_p != &local_1f0.m_desc.field_2) {
    operator_delete(local_1f0.m_desc._M_dataplus._M_p,
                    local_1f0.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0.m_name._M_dataplus._M_p != &local_1f0.m_name.field_2) {
    operator_delete(local_1f0.m_name._M_dataplus._M_p,
                    local_1f0.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_628._M_dataplus._M_p != &local_628.field_2) {
    operator_delete(local_628._M_dataplus._M_p,local_628.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_608._M_dataplus._M_p != &local_608.field_2) {
    operator_delete(local_608._M_dataplus._M_p,local_608.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e8._M_dataplus._M_p != &local_5e8.field_2) {
    operator_delete(local_5e8._M_dataplus._M_p,local_5e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.m_unit._M_dataplus._M_p != &local_180.m_unit.field_2) {
    operator_delete(local_180.m_unit._M_dataplus._M_p,
                    local_180.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.m_desc._M_dataplus._M_p != &local_180.m_desc.field_2) {
    operator_delete(local_180.m_desc._M_dataplus._M_p,
                    local_180.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.m_name._M_dataplus._M_p != &local_180.m_name.field_2) {
    operator_delete(local_180.m_name._M_dataplus._M_p,
                    local_180.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c8._M_dataplus._M_p != &local_5c8.field_2) {
    operator_delete(local_5c8._M_dataplus._M_p,local_5c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
    operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_588._M_dataplus._M_p != &local_588.field_2) {
    operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.m_unit._M_dataplus._M_p != &local_110.m_unit.field_2) {
    operator_delete(local_110.m_unit._M_dataplus._M_p,
                    local_110.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.m_desc._M_dataplus._M_p != &local_110.m_desc.field_2) {
    operator_delete(local_110.m_desc._M_dataplus._M_p,
                    local_110.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.m_name._M_dataplus._M_p != &local_110.m_name.field_2) {
    operator_delete(local_110.m_name._M_dataplus._M_p,
                    local_110.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_568._M_dataplus._M_p != &local_568.field_2) {
    operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_548._M_dataplus._M_p != &local_548.field_2) {
    operator_delete(local_548._M_dataplus._M_p,local_548.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_528._M_dataplus._M_p != &local_528.field_2) {
    operator_delete(local_528._M_dataplus._M_p,local_528.field_2._M_allocated_capacity + 1);
  }
  pRVar1 = local_4a8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.m_unit._M_dataplus._M_p != &local_a0.m_unit.field_2) {
    operator_delete(local_a0.m_unit._M_dataplus._M_p,
                    local_a0.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.m_desc._M_dataplus._M_p != &local_a0.m_desc.field_2) {
    operator_delete(local_a0.m_desc._M_dataplus._M_p,
                    local_a0.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.m_name._M_dataplus._M_p != &local_a0.m_name.field_2) {
    operator_delete(local_a0.m_name._M_dataplus._M_p,
                    local_a0.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_508._M_dataplus._M_p != &local_508.field_2) {
    operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
    operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
    operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
  }
  tcu::TestContext::setTestResult
            ((pRVar1->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  return STOP;
}

Assistant:

IterateResult iterate(void)
	{
		const tcu::RenderTarget& renderTarget = m_context.getRenderContext().getRenderTarget();
		const tcu::PixelFormat&  pixelFormat  = renderTarget.getPixelFormat();

		m_testCtx.getLog() << TestLog::Integer("Width", "Width", "px", QP_KEY_TAG_NONE, renderTarget.getWidth())
						   << TestLog::Integer("Height", "Height", "px", QP_KEY_TAG_NONE, renderTarget.getHeight())
						   << TestLog::Integer("RedBits", "Red bits", "", QP_KEY_TAG_NONE, pixelFormat.redBits)
						   << TestLog::Integer("GreenBits", "Green bits", "", QP_KEY_TAG_NONE, pixelFormat.greenBits)
						   << TestLog::Integer("BlueBits", "Blue bits", "", QP_KEY_TAG_NONE, pixelFormat.blueBits)
						   << TestLog::Integer("AlphaBits", "Alpha bits", "", QP_KEY_TAG_NONE, pixelFormat.alphaBits)
						   << TestLog::Integer("DepthBits", "Depth bits", "", QP_KEY_TAG_NONE,
											   renderTarget.getDepthBits())
						   << TestLog::Integer("StencilBits", "Stencil bits", "", QP_KEY_TAG_NONE,
											   renderTarget.getStencilBits())
						   << TestLog::Integer("SampleCount", "Sample count", "", QP_KEY_TAG_NONE,
											   renderTarget.getNumSamples());

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}